

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

int TPZFMatrix<double>::Substitution
              (double *ptr,int64_t rows,TPZFMatrix<double> *B,TPZVec<int> *index)

{
  int *piVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  int64_t iVar8;
  double dVar9;
  TPZVec<double> v;
  TPZVec<double> local_40;
  
  if (B == (TPZFMatrix<double> *)0x0) {
    poVar3 = (ostream *)&std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "static int TPZFMatrix<double>::Substitution(const TVar *, int64_t, TPZFMatrix<TVar> *, const TPZVec<int> &) [TVar = double]"
               ,0x7b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZFMatrix<>*B eh nulo",0x16);
    lVar4 = std::cerr;
  }
  else {
    if ((index->fNElements == rows) &&
       ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow == rows)) {
      TPZVec<double>::TPZVec(&local_40,rows);
      if (0 < rows) {
        piVar1 = index->fStore;
        pdVar5 = B->fElem;
        lVar4 = 0;
        do {
          local_40.fStore[lVar4] = pdVar5[piVar1[lVar4]];
          lVar4 = lVar4 + 1;
        } while (rows != lVar4);
      }
      if (0 < rows) {
        lVar4 = 0;
        pdVar5 = ptr;
        do {
          dVar9 = 0.0;
          if (lVar4 != 0) {
            lVar7 = 0;
            pdVar6 = pdVar5;
            do {
              dVar9 = dVar9 + *pdVar6 * local_40.fStore[lVar7];
              lVar7 = lVar7 + 1;
              pdVar6 = pdVar6 + rows;
            } while (lVar4 != lVar7);
          }
          local_40.fStore[lVar4] = local_40.fStore[lVar4] - dVar9;
          lVar4 = lVar4 + 1;
          pdVar5 = pdVar5 + 1;
        } while (lVar4 != rows);
      }
      if (0 < rows) {
        pdVar5 = (double *)((long)ptr + (rows * 8 + 8) * rows + -8);
        lVar4 = 0;
        iVar8 = rows;
        do {
          dVar9 = 0.0;
          pdVar6 = pdVar5;
          lVar7 = lVar4;
          if (iVar8 < rows) {
            do {
              dVar9 = dVar9 + *pdVar6 * local_40.fStore[rows + lVar7];
              lVar7 = lVar7 + 1;
              pdVar6 = pdVar6 + rows;
            } while (lVar7 != 0);
          }
          lVar7 = iVar8 + -1;
          local_40.fStore[lVar7] = (local_40.fStore[lVar7] - dVar9) / ptr[lVar7 * (rows + 1)];
          lVar4 = lVar4 + -1;
          pdVar5 = (double *)((long)pdVar5 + (rows * 8 ^ 0xfffffffffffffff8U));
          bVar2 = 1 < iVar8;
          iVar8 = lVar7;
        } while (bVar2);
      }
      if (0 < rows) {
        pdVar5 = B->fElem;
        lVar4 = 0;
        do {
          pdVar5[lVar4] = local_40.fStore[lVar4];
          lVar4 = lVar4 + 1;
        } while (rows != lVar4);
      }
      local_40._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
      if (local_40.fStore != (double *)0x0) {
        operator_delete__(local_40.fStore);
      }
      return 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_35dfef,0x43);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"this->fIndex = ",0xf);
    poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  b = ",6);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    lVar4 = *(long *)poVar3;
  }
  std::ios::widen((char)*(undefined8 *)(lVar4 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return 0;
}

Assistant:

int TPZFMatrix<TVar>::Substitution(const TVar *ptr, int64_t rows, TPZFMatrix<TVar> *B, const TPZVec<int> &index )
{
    
    if(!B){
        PZError << __PRETTY_FUNCTION__ << "TPZFMatrix<>*B eh nulo" << endl;
        return 0;
    }
    
    TPZFMatrix<TVar> &b = *B;
    
    
    
    if (index.NElements() != rows || b.Rows() != rows)
    {
        cout << "TMatrix::Substituicao ERRO : vetores com dimensões incompativeis:\n"
        << "this->fIndex = " << index.NElements() << "  b = " << b.Rows() << endl;
        return 0;
    }
    
    int64_t i,j;
    TVar sum = 0;
    
    TPZVec<TVar> v(rows);
    
    
    for (i=0;i<rows;i++)
    {
        v[i] = b(index[i]);
    }
    
    //Ly=b
    for (i=0;i<rows;i++)
    {
        sum = 0.;
        for (j=0;j<(i);j++) sum += SELECTEL(ptr,rows,i,j) * v[j];
        v[i] -= sum;
    }
    
    //Ux=y
    for (i=(rows-1);i>-1;i--)
    {
        sum = 0.;
        for (j=(i+1);j<rows;j++) sum += SELECTEL(ptr,rows,i,j) * v[j];
        v[i] = (v[i] - sum) / SELECTEL(ptr,rows,i,i);
    }
    
    for (i=0;i<rows;i++) b(i) = v[i];
    return 1;
}